

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSampleComputeInstance *this)

{
  ShaderInputInterface SVar1;
  DescriptorUpdateMethod DVar2;
  VkDescriptorType type;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  deUint32 numDescriptors;
  ostream *poVar6;
  ComputePipeline *pCVar7;
  ComputePipeline *immutableSampler;
  VkDescriptorUpdateTemplateKHR updateTemplate;
  int resultNdx;
  uint samplePosNdx;
  long lVar8;
  char *pcVar9;
  pointer rawUpdateData;
  VkDescriptorSetLayout *descriptorSetLayouts;
  Vec4 *v;
  byte bVar10;
  Vec4 result;
  ComputePipeline pipeline;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_438;
  Vector<float,_4> *local_410;
  ImageSampleInstanceImages *local_408;
  tcu local_3fc [4];
  undefined1 local_3f8 [16];
  Vec4 reference;
  Handle<(vk::HandleType)22> local_3d8;
  TextureFormat TStack_3d0;
  pointer local_3c8;
  VkDescriptorPool VStack_3c0;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_3b8;
  VkDescriptorSet descriptorSets [1];
  Vec4 samplingThreshold;
  undefined1 local_378 [8];
  Allocation *pAStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  ComputePipeline *local_358;
  ostringstream msg;
  Vector<unsigned_int,_3> local_1d8;
  uint local_1cc;
  Handle<(vk::HandleType)20> local_1c8;
  int local_1c0;
  VkDevice local_1b8;
  int local_1b0;
  Handle<(vk::HandleType)20> local_1a8;
  int local_1a0;
  VkBufferMemoryBarrier *local_198;
  Vec4 results [4];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  std::operator<<((ostream *)&msg,"Accessing resource in a compute program.\n");
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    poVar6 = std::operator<<((ostream *)&msg,"Single descriptor set. Descriptor set contains ");
    SVar1 = this->m_shaderInterface;
    if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar9 = "single";
    }
    else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pcVar9 = "two";
    }
    else {
      pcVar9 = (char *)0x0;
      if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar9 = "an array (size 2) of";
      }
    }
    poVar6 = std::operator<<(poVar6,pcVar9);
    pcVar9 = " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
LAB_0055cfd3:
    std::operator<<(poVar6,pcVar9);
  }
  else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    poVar6 = std::operator<<((ostream *)&msg,"Single descriptor set. Descriptor set contains ");
    SVar1 = this->m_shaderInterface;
    if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar9 = "single";
    }
    else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pcVar9 = "two";
    }
    else {
      pcVar9 = (char *)0x0;
      if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar9 = "an array (size 2) of";
      }
    }
    poVar6 = std::operator<<(poVar6,pcVar9);
    pcVar9 = " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
    goto LAB_0055cfd3;
  }
  poVar6 = std::operator<<((ostream *)&msg,"Image view type is ");
  pcVar9 = ::vk::getImageViewTypeName(this->m_viewType);
  poVar6 = std::operator<<(poVar6,pcVar9);
  std::operator<<(poVar6,"\n");
  if (this->m_baseMipLevel != 0) {
    poVar6 = std::operator<<((ostream *)&msg,"Image view base mip level = ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"\n");
  }
  if (this->m_baseArraySlice != 0) {
    poVar6 = std::operator<<((ostream *)&msg,"Image view base array slice = ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"\n");
  }
  pcVar9 = "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar9 = "Sampler mode is LINEAR, with WRAP\n";
  }
  std::operator<<((ostream *)&msg,pcVar9);
  for (samplePosNdx = 0; samplePosNdx != 4; samplePosNdx = samplePosNdx + 1) {
    poVar6 = std::operator<<((ostream *)&msg,"Test sample ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,samplePosNdx);
    poVar6 = std::operator<<(poVar6,": sample at position ");
    ImageSampleInstanceImages::getSamplePos
              ((ImageSampleInstanceImages *)local_378,this->m_viewType,this->m_baseMipLevel,
               this->m_baseArraySlice,samplePosNdx);
    tcu::operator<<(poVar6,(Vector<float,_4> *)local_378);
    if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar9 = " from combined image sampler ";
      if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
        if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_0055d172;
        pcVar9 = " using sampler ";
      }
      poVar6 = std::operator<<((ostream *)&msg,pcVar9);
      std::ostream::operator<<(poVar6,samplePosNdx & 1);
    }
LAB_0055d172:
    std::operator<<((ostream *)&msg,"\n");
  }
  local_378 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pAStack_370);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&pAStack_370,(string *)&pipeline);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pCVar7 = &pipeline;
  std::__cxx11::string::~string((string *)pCVar7);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pAStack_370);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal
       = (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
  pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
       m_internal;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_378);
  DVar2 = this->m_updateMethod;
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)local_378,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)local_378,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,0x20);
  }
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    pCVar7 = &pipeline;
    if ((this->m_images).m_isImmutable == false) {
      pCVar7 = (ComputePipeline *)0x0;
    }
    ::vk::DescriptorSetLayoutBuilder::addBinding
              ((DescriptorSetLayoutBuilder *)local_378,this->m_descriptorType,2,0x20,
               (VkSampler *)pCVar7);
  }
  else {
    if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pCVar7 = &pipeline;
      if ((this->m_images).m_isImmutable == false) {
        pCVar7 = (ComputePipeline *)0x0;
      }
      ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
                ((DescriptorSetLayoutBuilder *)local_378,this->m_descriptorType,0x20,
                 (VkSampler *)pCVar7);
      pCVar7 = (ComputePipeline *)
               &pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter;
    }
    else if (SVar1 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_0055d307;
    immutableSampler = (ComputePipeline *)0x0;
    if ((this->m_images).m_isImmutable != false) {
      immutableSampler = pCVar7;
    }
    ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
              ((DescriptorSetLayoutBuilder *)local_378,this->m_descriptorType,0x20,
               (VkSampler *)immutableSampler);
  }
LAB_0055d307:
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&msg,(DescriptorSetLayoutBuilder *)local_378,
             this->m_vki,this->m_device,
             (uint)((DVar2 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
                   DESCRIPTOR_UPDATE_METHOD_WITH_PUSH));
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_378);
  local_438.m_data.object.m_internal = _msg;
  _msg = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&msg);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&msg);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)&msg,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  type = this->m_descriptorType;
  numDescriptors = getInterfaceNumResources(this->m_shaderInterface);
  ::vk::DescriptorPoolBuilder::addType((DescriptorPoolBuilder *)&msg,type,numDescriptors);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    ::vk::DescriptorPoolBuilder::addType
              ((DescriptorPoolBuilder *)&msg,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,1);
  }
  descriptorSetLayouts = (VkDescriptorSetLayout *)0x1;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_378,(DescriptorPoolBuilder *)&msg,
             this->m_vki,this->m_device,1,1);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&msg);
  local_3b8.m_data.object.m_internal = (deUint64)local_378;
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)pAStack_370;
  local_3b8.m_data.deleter.m_device = (VkDevice)local_368._M_allocated_capacity;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_368._8_8_;
  local_378 = (undefined1  [8])0x0;
  pAStack_370 = (Allocation *)0x0;
  local_368._M_allocated_capacity = 0;
  local_368._8_4_ = R;
  local_368._12_4_ = SNORM_INT8;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_378);
  local_378._0_4_ = 0x22;
  pAStack_370 = (Allocation *)0x0;
  local_358 = &pipeline;
  pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal
       = local_438.m_data.object.m_internal;
  local_368._M_allocated_capacity = local_3b8.m_data.object.m_internal;
  local_368._8_4_ = A;
  if ((this->m_updateMethod & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
      DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    _msg = 0;
  }
  else {
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&msg,this->m_vki,this->m_device,
               (VkDescriptorSetAllocateInfo *)local_378);
    writeDescriptorSet(this,_msg,
                       (VkDescriptorSetLayout)
                       pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                       m_data.object.m_internal,(VkPipelineLayout)0x0);
  }
  local_3d8.m_internal = _msg;
  TStack_3d0.order = R;
  TStack_3d0.type = SNORM_INT8;
  local_3c8 = (pointer)0x0;
  VStack_3c0.m_internal = 0;
  _msg = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&msg);
  ComputePipeline::ComputePipeline
            (&pipeline,this->m_vki,this->m_device,
             ((this->super_TestInstance).m_context)->m_progCollection,(deUint32)&local_438,
             descriptorSetLayouts);
  descriptorSets[0].m_internal = (VkDescriptorSet)(VkDescriptorSet)local_3d8.m_internal;
  DVar2 = this->m_updateMethod;
  local_378 = (undefined1  [8])0x100000004;
  pAStack_370 = (Allocation *)CONCAT44(pAStack_370._4_4_,1);
  _msg = (deUint64)this->m_vki;
  tcu::Vector<unsigned_int,_3>::Vector(&local_1d8,(Vector<unsigned_int,_3> *)local_378);
  local_1cc = (uint)(DVar2 - DESCRIPTOR_UPDATE_METHOD_LAST < 0xfffffffe);
  local_1c0 = 0;
  local_1b8 = (VkDevice)0x0;
  local_1b0 = 0;
  local_1a8.m_internal = 0;
  lVar8 = 0;
  local_1c8.m_internal = (deUint64)descriptorSets;
  local_1a0 = 1;
  local_198 = &(this->m_result).m_bufferBarrier;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)results[0].m_data + lVar8));
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    writeDescriptorSet(this,(VkDescriptorSet)0x0,
                       (VkDescriptorSetLayout)local_438.m_data.object.m_internal,
                       (VkPipelineLayout)
                       pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                       m_data.object.m_internal);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)&msg,this->m_queueFamilyIndex,this->m_queue,&this->m_updateBuilder)
    ;
  }
  else {
    updateTemplate.m_internal = 0;
    rawUpdateData = (pointer)0x0;
    if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      writeDescriptorSet(this,(VkDescriptorSet)0x0,
                         (VkDescriptorSetLayout)local_438.m_data.object.m_internal,
                         (VkPipelineLayout)
                         pipeline.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                         m_data.object.m_internal);
      updateTemplate.m_internal =
           (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal;
      rawUpdateData =
           (this->m_updateRegistry).m_updateEntries.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ComputeCommand::submitAndWait
              ((ComputeCommand *)&msg,this->m_queueFamilyIndex,this->m_queue,updateTemplate,
               rawUpdateData);
  }
  v = results;
  ComputeInstanceResultBuffer::readResultContentsTo(&this->m_result,&v);
  local_408 = &this->m_images;
  bVar3 = true;
  bVar10 = 0;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    tcu::Vector<float,_4>::Vector(&result,v);
    ImageSampleInstanceImages::fetchSampleValue
              ((ImageSampleInstanceImages *)&reference,(int)local_408);
    tcu::Vector<float,_4>::Vector(&samplingThreshold,0.03137255);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_378,-1.0);
    bVar4 = tcu::Vector<float,_4>::operator!=(&result,(Vector<float,_4> *)local_378);
    tcu::operator-((tcu *)local_3f8,&result,&reference);
    tcu::abs<float,4>((tcu *)local_378,(Vector<float,_4> *)local_3f8);
    tcu::greaterThan<float,4>(local_3fc,(Vector<float,_4> *)local_378,&samplingThreshold);
    bVar5 = tcu::boolAny<4>((Vector<bool,_4> *)local_3fc);
    if (bVar5) {
      local_378 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
      local_410 = v;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pAStack_370);
      std::operator<<((ostream *)&pAStack_370,"Test sample ");
      std::ostream::operator<<((ostringstream *)&pAStack_370,(int)lVar8);
      std::operator<<((ostream *)&pAStack_370,":\n");
      std::operator<<((ostream *)&pAStack_370,"\tSampling at ");
      ImageSampleInstanceImages::getSamplePos
                ((ImageSampleInstanceImages *)local_3f8,this->m_viewType,this->m_baseMipLevel,
                 this->m_baseArraySlice,(int)lVar8);
      tcu::operator<<((ostream *)&pAStack_370,(Vector<float,_4> *)local_3f8);
      std::operator<<((ostream *)&pAStack_370,"\n");
      std::operator<<((ostream *)&pAStack_370,"\tError expected ");
      tcu::operator<<((ostream *)&pAStack_370,&reference);
      std::operator<<((ostream *)&pAStack_370,", got ");
      tcu::operator<<((ostream *)&pAStack_370,&result);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pAStack_370);
      bVar3 = false;
      v = local_410;
    }
    bVar10 = bVar10 | bVar4;
    v = v + 1;
  }
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Pass",(allocator<char> *)&result);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_378);
  }
  else if (bVar10 == 0) {
    local_378 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pAStack_370);
    std::operator<<((ostream *)&pAStack_370,"Result buffer was not written to.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pAStack_370);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Result buffer was not written to",(allocator<char> *)&result);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_378);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Invalid result values",(allocator<char> *)&result);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_378);
  }
  std::__cxx11::string::~string((string *)local_378);
  ComputePipeline::~ComputePipeline(&pipeline);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&stack0xfffffffffffffc28);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_3b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_438);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSampleComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}